

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

void OutputFlatDependencies
               (Configuration *config,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
               *components,path *outfile)

{
  _Hash_node_base *p_Var1;
  ostream *poVar2;
  char *pcVar3;
  string *psVar4;
  _Hash_node_base *p_Var5;
  ofstream *poVar6;
  __node_base *p_Var7;
  pair<std::_Rb_tree_iterator<Component_*>,_bool> pVar8;
  string local_2a8;
  string local_288;
  set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_> depcomps;
  OstreamHolder outHolder;
  
  OstreamHolder::OstreamHolder(&outHolder,outfile);
  poVar6 = &outHolder.out;
  if (outHolder.isStdout != false) {
    poVar6 = (ofstream *)&std::cout;
  }
  poVar2 = std::operator<<((ostream *)poVar6,"digraph dependencies {");
  std::operator<<(poVar2,'\n');
  p_Var7 = &(components->_M_h)._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    p_Var5 = p_Var7[5]._M_nxt;
    if (((_Hash_node_base *)0x2 < p_Var5[1]._M_nxt) &&
       (p_Var5[0x34]._M_nxt != (_Hash_node_base *)0x0)) {
      poVar2 = std::operator<<((ostream *)poVar6,"  ");
      Component::QuotedName_abi_cxx11_((string *)&depcomps,(Component *)p_Var7[5]._M_nxt);
      poVar2 = std::operator<<(poVar2,(string *)&depcomps);
      poVar2 = std::operator<<(poVar2," [shape=");
      pcVar3 = getShapeForSize((Component *)p_Var7[5]._M_nxt);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2,"];\n");
      std::__cxx11::string::~string((string *)&depcomps);
      p_Var5 = p_Var7[5]._M_nxt;
    }
    depcomps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    depcomps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    depcomps._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &depcomps._M_t._M_impl.super__Rb_tree_header._M_header;
    depcomps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var5 = p_Var5 + 0x11;
    depcomps._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         depcomps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      if (((_Hash_node_base *)0x2 < p_Var5[1]._M_nxt[1]._M_nxt) &&
         (p_Var5[1]._M_nxt[0x34]._M_nxt != (_Hash_node_base *)0x0)) {
        p_Var1 = p_Var5 + 1;
        pVar8 = std::
                _Rb_tree<Component*,Component*,std::_Identity<Component*>,std::less<Component*>,std::allocator<Component*>>
                ::_M_insert_unique<Component*const&>
                          ((_Rb_tree<Component*,Component*,std::_Identity<Component*>,std::less<Component*>,std::allocator<Component*>>
                            *)&depcomps,(Component **)p_Var1);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          poVar2 = std::operator<<((ostream *)poVar6,"  ");
          Component::QuotedName_abi_cxx11_(&local_288,(Component *)p_Var7[5]._M_nxt);
          poVar2 = std::operator<<(poVar2,(string *)&local_288);
          poVar2 = std::operator<<(poVar2," -> ");
          Component::QuotedName_abi_cxx11_(&local_2a8,(Component *)p_Var1->_M_nxt);
          poVar2 = std::operator<<(poVar2,(string *)&local_2a8);
          poVar2 = std::operator<<(poVar2," [color=");
          psVar4 = getLinkColor_abi_cxx11_
                             (config,(Component *)p_Var7[5]._M_nxt,(Component *)p_Var1->_M_nxt);
          poVar2 = std::operator<<(poVar2,(string *)psVar4);
          poVar2 = std::operator<<(poVar2,"];");
          std::operator<<(poVar2,'\n');
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_288);
        }
      }
    }
    p_Var5 = p_Var7[5]._M_nxt + 10;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      if (((_Hash_node_base *)0x2 < p_Var5[1]._M_nxt[1]._M_nxt) &&
         (p_Var5[1]._M_nxt[0x34]._M_nxt != (_Hash_node_base *)0x0)) {
        p_Var1 = p_Var5 + 1;
        pVar8 = std::
                _Rb_tree<Component*,Component*,std::_Identity<Component*>,std::less<Component*>,std::allocator<Component*>>
                ::_M_insert_unique<Component*const&>
                          ((_Rb_tree<Component*,Component*,std::_Identity<Component*>,std::less<Component*>,std::allocator<Component*>>
                            *)&depcomps,(Component **)p_Var1);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          poVar2 = std::operator<<((ostream *)poVar6,"  ");
          Component::QuotedName_abi_cxx11_(&local_288,(Component *)p_Var7[5]._M_nxt);
          poVar2 = std::operator<<(poVar2,(string *)&local_288);
          poVar2 = std::operator<<(poVar2," -> ");
          Component::QuotedName_abi_cxx11_(&local_2a8,(Component *)p_Var1->_M_nxt);
          poVar2 = std::operator<<(poVar2,(string *)&local_2a8);
          poVar2 = std::operator<<(poVar2," [color=");
          psVar4 = getLinkColor_abi_cxx11_
                             (config,(Component *)p_Var7[5]._M_nxt,(Component *)p_Var1->_M_nxt);
          poVar2 = std::operator<<(poVar2,(string *)psVar4);
          poVar2 = std::operator<<(poVar2,"];");
          std::operator<<(poVar2,'\n');
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_288);
        }
      }
    }
    std::
    _Rb_tree<Component_*,_Component_*,_std::_Identity<Component_*>,_std::less<Component_*>,_std::allocator<Component_*>_>
    ::~_Rb_tree((_Rb_tree<Component_*,_Component_*,_std::_Identity<Component_*>,_std::less<Component_*>,_std::allocator<Component_*>_>
                 *)&depcomps);
  }
  poVar2 = std::operator<<((ostream *)poVar6,"}");
  std::operator<<(poVar2,'\n');
  boost::filesystem::basic_ofstream<char,_std::char_traits<char>_>::~basic_ofstream(&outHolder.out);
  return;
}

Assistant:

void OutputFlatDependencies(const Configuration& config, std::unordered_map<std::string, Component *> &components, const filesystem::path &outfile) {
    OstreamHolder outHolder(outfile);
    std::ostream& out = outHolder.get();
    out << "digraph dependencies {" << '\n';
    for (const auto &c : components) {
        if (c.second->root.string().size() > 2 &&
            c.second->files.size()) {
            out << "  " << c.second->QuotedName() << " [shape=" << getShapeForSize(c.second) << "];\n";
        }

        std::set<Component *> depcomps;
        for (auto &d : c.second->privDeps) {
            if (d->root.string().size() > 2 &&
                d->files.size()) {
                if (depcomps.insert(d).second) {
                    out << "  " << c.second->QuotedName() << " -> " << d->QuotedName() << " [color="
                        << getLinkColor(config, c.second, d) << "];" << '\n';
                }
            }
        }
        for (auto &d : c.second->pubDeps) {
            if (d->root.string().size() > 2 &&
                d->files.size()) {
                if (depcomps.insert(d).second) {
                    out << "  " << c.second->QuotedName() << " -> " << d->QuotedName() << " [color="
                        << getLinkColor(config, c.second, d) << "];" << '\n';
                }
            }
        }
    }
    out << "}" << '\n';
}